

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O2

void __thiscall LinkedList::control(LinkedList *this)

{
  bool bVar1;
  ostream *poVar2;
  LinkedList *this_00;
  allocator<char> local_e1;
  int stopLoop;
  int linkedListType;
  Node *head;
  string prependPrompt;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  head = (Node *)0x0;
  do {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Enter 1 to prepend, 2 to append, 3 to delete, 4 to insert, and 5 to view list."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (LinkedList *)&std::cin;
    std::istream::operator>>((istream *)&std::cin,&linkedListType);
    switch(linkedListType) {
    case 1:
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prependPrompt,"Enter a number to prepend to linked list.",&local_e1);
        std::__cxx11::string::string((string *)&local_50,(string *)&prependPrompt);
        bVar1 = handleActions(this,&local_50,&head,1);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&prependPrompt);
      } while (bVar1);
      break;
    case 2:
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prependPrompt,"Enter a number to append to linked list.",&local_e1);
        std::__cxx11::string::string((string *)&local_70,(string *)&prependPrompt);
        bVar1 = handleActions(this,&local_70,&head,2);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&prependPrompt);
      } while (bVar1);
      break;
    case 3:
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prependPrompt,"Enter a number to delete from the linked list.",
                   &local_e1);
        std::__cxx11::string::string((string *)&local_90,(string *)&prependPrompt);
        bVar1 = handleActions(this,&local_90,&head,3);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&prependPrompt);
      } while (bVar1);
      break;
    case 4:
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prependPrompt,"Enter a number to insert into the linked list.",
                   &local_e1);
        std::__cxx11::string::string((string *)&local_b0,(string *)&prependPrompt);
        bVar1 = handleActions(this,&local_b0,&head,4);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&prependPrompt);
      } while (bVar1);
      break;
    case 5:
      printList(this_00,head);
      break;
    default:
      poVar2 = std::operator<<((ostream *)&std::cout,"Error occurred");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Enter 0 to continue manipulating the linked list or 1 to exit.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::istream::operator>>((istream *)&std::cin,&stopLoop);
  } while (stopLoop == 0);
  return;
}

Assistant:

void LinkedList::control() {
	int linkedListType, stopLoop;

	// Head node
	Node* head = nullptr;

	while (true) {
		std::cout << "Enter 1 to prepend, 2 to append, 3 to delete, 4 to insert, and 5 to view list." << std::endl;
		std::cin >> linkedListType;

		// Prepend
		if (linkedListType == 1) {
			while (true) {
				std::string prependPrompt = "Enter a number to prepend to linked list.";
				
				if (handleActions(prependPrompt, &head, 1)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Append
		else if (linkedListType == 2) {
			while (true) {
				std::string appendPrompt = "Enter a number to append to linked list.";
				
				if (handleActions(appendPrompt, &head, 2)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Delete
		else if (linkedListType == 3) {
			while (true) {
				std::string deletionPrompt = "Enter a number to delete from the linked list.";
				
				if (handleActions(deletionPrompt, &head, 3)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// Insert
		else if (linkedListType == 4) {
			while (true) {
				std::string deletionPrompt = "Enter a number to insert into the linked list.";
				
				if (handleActions(deletionPrompt, &head, 4)) {
					continue;
				}
				else {
					break;
				}
			}
		}
		// View
		else if (linkedListType == 5) {
			printList(head);
		}
		// Exception
		else {
			std::cout << "Error occurred" << std::endl;
		}

		std::cout << "Enter 0 to continue manipulating the linked list or 1 to exit." << std::endl;
		std::cin >> stopLoop;

		if (stopLoop == 0) {
			continue;
		}
		else {
			break;
		}
	}
}